

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

void CChat::Com_All(IResult *pResult,void *pContext)

{
  CChat *this;
  int iVar1;
  undefined4 extraout_var;
  
  this = *(CChat **)((long)pContext + 0x18);
  this->m_aChatCmdBuffer[0] = '\0';
  if (pResult->m_NumArgs != 0) {
    iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
    str_copy(this->m_aChatCmdBuffer,(char *)CONCAT44(extraout_var,iVar1),0x400);
  }
  EnableMode(this,1,this->m_aChatCmdBuffer);
  return;
}

Assistant:

void CChat::Com_All(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	pChatData->m_aChatCmdBuffer[0] = '\0';
	if(pResult->NumArguments())
	{
		// save the parameter in a buffer before EnableMode clears it
		str_copy(pChatData->m_aChatCmdBuffer, pResult->GetString(0), sizeof(pChatData->m_aChatCmdBuffer));
	}
	pChatData->EnableMode(CHAT_ALL, pChatData->m_aChatCmdBuffer);
}